

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FIReader.cpp
# Opt level: O2

void __thiscall Assimp::FIFloatValueImpl::~FIFloatValueImpl(FIFloatValueImpl *this)

{
  (this->super_FIFloatValue).super_FIValue._vptr_FIValue =
       (_func_int **)&PTR_toString_abi_cxx11__007e64e8;
  std::__cxx11::string::~string((string *)&this->strValue);
  FIFloatValue::~FIFloatValue(&this->super_FIFloatValue);
  return;
}

Assistant:

inline FIFloatValueImpl(std::vector<float> &&value_): strValueValid(false) { value = std::move(value_); }